

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void remove_damage(monst *shkp,boolean croaked)

{
  char cVar1;
  char y;
  level *lev;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  xchar xVar5;
  boolean bVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar13;
  char *pcVar14;
  int y_00;
  uint uVar15;
  damage *tmp_dam;
  damage *pdVar16;
  int x;
  bool bVar17;
  bool bVar18;
  char shops [5];
  char local_45;
  char local_44;
  undefined8 local_40;
  rm (*local_38) [21];
  
  xVar5 = ledger_no((d_level *)&shkp[0x1b].mxlth);
  lev = levels[xVar5];
  tmp_dam = lev->damagelist;
  if (tmp_dam == (damage *)0x0) {
    bVar17 = true;
    bVar8 = 0;
    bVar3 = true;
    bVar18 = true;
    bVar4 = true;
    bVar2 = true;
  }
  else {
    local_38 = lev->locations;
    pdVar16 = (damage *)0x0;
    bVar2 = false;
    bVar8 = 0;
    bVar4 = false;
    cVar7 = '\0';
    bVar3 = false;
    local_40 = 0;
    do {
      cVar1 = (tmp_dam->place).x;
      x = (int)cVar1;
      y = (tmp_dam->place).y;
      y_00 = (int)y;
      pcVar11 = in_rooms(lev,cVar1,y,0x12);
      strcpy(&local_45,pcVar11);
      pcVar11 = strchr(&local_45,(int)(char)shkp[0x1b].meating);
      if (pcVar11 == (char *)0x0) {
        uVar12 = 0;
      }
      else if (croaked == '\0') {
        if (cVar7 == '\0') {
          bVar6 = closed_door(lev,x,y_00);
          if (bVar6 == '\0') {
            cVar7 = '\0';
          }
          else {
            cVar7 = picking_at(x,y_00);
          }
          iVar9 = repair_damage(lev,shkp,tmp_dam,'\0');
          uVar12 = CONCAT44(extraout_var_00,iVar9);
          if (iVar9 == 0) {
            cVar7 = '\0';
          }
        }
        else {
          iVar9 = repair_damage(lev,shkp,tmp_dam,'\0');
          uVar12 = CONCAT44(extraout_var,iVar9);
        }
      }
      else {
        uVar12 = (ulong)(local_44 == '\0');
      }
      iVar9 = (int)uVar12;
      if (iVar9 == 1) {
LAB_002384d0:
        tmp_dam = tmp_dam->next;
        if (pdVar16 == (damage *)0x0) {
          free(lev->damagelist);
          lev->damagelist = tmp_dam;
        }
        else {
          free(pdVar16->next);
          pdVar16->next = tmp_dam;
        }
      }
      else {
        if (iVar9 != 0) {
          if ((viz_array[y_00][x] & 2U) == 0) {
            bVar2 = true;
          }
          else {
            cVar1 = local_38[x][y_00].typ;
            if (cVar1 < '\r' && cVar1 != '\0') {
              bVar2 = true;
              bVar8 = bVar8 + 1;
            }
            else if (cVar1 == '\x17') {
              bVar2 = true;
              local_40 = CONCAT71((int7)(uVar12 >> 8),1);
            }
            else {
              bVar2 = true;
              if (iVar9 == 3) {
                bVar4 = true;
              }
              else {
                bVar3 = true;
              }
            }
          }
          goto LAB_002384d0;
        }
        pdVar16 = tmp_dam;
        tmp_dam = tmp_dam->next;
      }
    } while (tmp_dam != (damage *)0x0);
    bVar2 = !bVar2;
    bVar17 = (char)local_40 == '\0';
    bVar3 = !bVar3;
    bVar4 = !bVar4;
    bVar18 = cVar7 == '\0';
  }
  if (bVar2) {
    return;
  }
  if (bVar8 == 0) {
    if (bVar17) {
      if (bVar3) {
        if (bVar4) {
          uVar10 = *(uint *)&level->locations[u.ux][u.uy].field_0x6;
          uVar15 = uVar10 >> 0x10 & 0x3f;
          bVar8 = 0;
          if ((uVar10 >> 0x16 & 1) == 0 && 2 < uVar15) {
            bVar8 = 0;
            if ('\x11' < level->rooms[uVar15 - 3].rtype) {
              bVar8 = (byte)(uVar10 >> 0x10) & 0x3f;
            }
          }
          if (bVar8 != (byte)shkp[0x1b].meating) {
            if ((flags.soundok != '\0') &&
               (uVar10 = mt_random(),
               (uVar10 * -0x33333333 >> 1 | (uint)((uVar10 * -0x33333333 & 1) != 0) << 0x1f) <
               0x1999999a)) {
              Norep("The dungeon acoustics noticeably change.");
            }
            goto LAB_00238686;
          }
          pcVar11 = "You feel more claustrophobic than before.";
        }
        else {
          pcVar11 = "Suddenly, the trap is removed from the floor!";
        }
      }
      else {
        pcVar11 = "Suddenly, the floor damage is gone!";
      }
    }
    else {
      pcVar11 = "Suddenly, the shop door reappears!";
    }
  }
  else {
    if (bVar8 == 1) {
      pcVar11 = "a";
      pcVar14 = "";
      pcVar13 = "s";
    }
    else {
      pcVar11 = "several";
      if (bVar8 < 4) {
        pcVar11 = "some";
      }
      pcVar14 = "s";
      pcVar13 = "";
    }
    pline("Suddenly, %s section%s of wall close%s up!",pcVar11,pcVar14,pcVar13);
    if (!bVar17) {
      pline("The shop door reappears!");
    }
    if (bVar3) goto LAB_00238686;
    pcVar11 = "The floor is repaired!";
  }
  pline(pcVar11);
LAB_00238686:
  if (!bVar18) {
    stop_occupation();
  }
  return;
}

Assistant:

static void remove_damage(struct monst *shkp, boolean croaked)
{
	struct damage *tmp_dam, *tmp2_dam;
	boolean did_repair = FALSE, saw_door = FALSE;
	boolean saw_floor = FALSE, stop_picking = FALSE;
	boolean saw_untrap = FALSE;
	uchar saw_walls = 0;
	struct level *lev = levels[ledger_no(&ESHK(shkp)->shoplevel)];

	tmp_dam = lev->damagelist;
	tmp2_dam = 0;
	while (tmp_dam) {
	    xchar x = tmp_dam->place.x, y = tmp_dam->place.y;
	    char shops[5];
	    int disposition;

	    disposition = 0;
	    strcpy(shops, in_rooms(lev, x, y, SHOPBASE));
	    if (strchr(shops, ESHK(shkp)->shoproom)) {
		if (croaked)
		    disposition = (shops[1])? 0 : 1;
		else if (stop_picking)
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		else {
		    /* Defer the stop_occupation() until after repair msgs */
		    if (closed_door(lev, x, y))
			stop_picking = picking_at(x, y);
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		    if (!disposition)
			stop_picking = FALSE;
		}
	    }

	    if (!disposition) {
		tmp2_dam = tmp_dam;
		tmp_dam = tmp_dam->next;
		continue;
	    }

	    if (disposition > 1) {
		did_repair = TRUE;
		if (cansee(x, y)) {
		    if (IS_WALL(lev->locations[x][y].typ))
			saw_walls++;
		    else if (IS_DOOR(lev->locations[x][y].typ))
			saw_door = TRUE;
		    else if (disposition == 3)		/* untrapped */
			saw_untrap = TRUE;
		    else
			saw_floor = TRUE;
		}
	    }

	    tmp_dam = tmp_dam->next;
	    if (!tmp2_dam) {
		free(lev->damagelist);
		lev->damagelist = tmp_dam;
	    } else {
		free(tmp2_dam->next);
		tmp2_dam->next = tmp_dam;
	    }
	}
	if (!did_repair)
	    return;
	if (saw_walls) {
	    pline("Suddenly, %s section%s of wall close%s up!",
		  (saw_walls == 1) ? "a" : (saw_walls <= 3) ?
						  "some" : "several",
		  (saw_walls == 1) ? "" : "s", (saw_walls == 1) ? "s" : "");
	    if (saw_door)
		pline("The shop door reappears!");
	    if (saw_floor)
		pline("The floor is repaired!");
	} else {
	    if (saw_door)
		pline("Suddenly, the shop door reappears!");
	    else if (saw_floor)
		pline("Suddenly, the floor damage is gone!");
	    else if (saw_untrap)
	        pline("Suddenly, the trap is removed from the floor!");
	    else if (inside_shop(level, u.ux, u.uy) == ESHK(shkp)->shoproom)
		pline("You feel more claustrophobic than before.");
	    else if (flags.soundok && !rn2(10))
		Norep("The dungeon acoustics noticeably change.");
	}
	if (stop_picking)
		stop_occupation();
}